

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_rsa_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,EVP_PKEY **rsa_ctx)

{
  int iVar1;
  EVP_PKEY *pk;
  EVP_PKEY *rsa;
  uchar *comment;
  uchar *coeff;
  uchar *q;
  uchar *p;
  uchar *d;
  uchar *e;
  uchar *n;
  size_t commentlen;
  size_t coefflen;
  size_t qlen;
  size_t plen;
  size_t dlen;
  size_t elen;
  size_t nlen;
  size_t *psStack_68;
  int rc;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *session_local;
  
  nlen._4_4_ = 0;
  pk = (EVP_PKEY *)0x0;
  psStack_68 = pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local = (string_buf *)session;
  iVar1 = _libssh2_get_bignum_bytes(decrypted,&e,&elen);
  if (iVar1 == 0) {
    iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&d,&dlen);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&p,&plen);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&comment,&commentlen);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&q,&qlen);
          if (iVar1 == 0) {
            iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&coeff,&coefflen);
            if (iVar1 == 0) {
              iVar1 = _libssh2_get_string((string_buf *)method_local,(uchar **)&rsa,(size_t *)&n);
              if (iVar1 == 0) {
                nlen._4_4_ = _libssh2_rsa_new(&pk,d,dlen,e,elen,p,plen,q,qlen,coeff,coefflen,
                                              (uchar *)0x0,0,(uchar *)0x0,0,comment,commentlen);
                if (nlen._4_4_ == 0) {
                  iVar1 = 0;
                  if (((pk != (EVP_PKEY *)0x0) && (pubkeydata_len_local != (size_t *)0x0)) &&
                     (method_len_local != (size_t *)0x0)) {
                    iVar1 = gen_publickey_from_rsa_evp
                                      ((LIBSSH2_SESSION *)decrypted_local,(uchar **)method_len_local
                                       ,(size_t *)pubkeydata_local,(uchar **)pubkeydata_len_local,
                                       psStack_68,pk);
                  }
                  nlen._4_4_ = iVar1;
                  if (rsa_ctx == (EVP_PKEY **)0x0) {
                    EVP_PKEY_free((EVP_PKEY *)pk);
                  }
                  else {
                    *rsa_ctx = pk;
                  }
                  session_local._4_4_ = nlen._4_4_;
                }
                else {
                  if (pk != (EVP_PKEY *)0x0) {
                    EVP_PKEY_free((EVP_PKEY *)pk);
                  }
                  session_local._4_4_ =
                       _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-6,
                                      "Unable to allocate memory for private key data");
                }
              }
              else {
                _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no comment");
                session_local._4_4_ = -1;
              }
            }
            else {
              _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no q");
              session_local._4_4_ = -1;
            }
          }
          else {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no p");
            session_local._4_4_ = -1;
          }
        }
        else {
          _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no coeff");
          session_local._4_4_ = -1;
        }
      }
      else {
        _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no d");
        session_local._4_4_ = -1;
      }
    }
    else {
      _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no e");
      session_local._4_4_ = -1;
    }
  }
  else {
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"RSA no n");
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
gen_publickey_from_rsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                         struct string_buf *decrypted,
                                         unsigned char **method,
                                         size_t *method_len,
                                         unsigned char **pubkeydata,
                                         size_t *pubkeydata_len,
                                         libssh2_rsa_ctx **rsa_ctx)
{
    int rc = 0;
    size_t nlen, elen, dlen, plen, qlen, coefflen, commentlen;
    unsigned char *n, *e, *d, *p, *q, *coeff, *comment;
    libssh2_rsa_ctx *rsa = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing RSA keys from private key data"));

    /* public key data */
    if(_libssh2_get_bignum_bytes(decrypted, &n, &nlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no n");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &e, &elen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no e");
        return -1;
    }

    /* private key data */
    if(_libssh2_get_bignum_bytes(decrypted, &d, &dlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no d");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &coeff, &coefflen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no coeff");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &p, &plen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no p");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &q, &qlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no q");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &comment, &commentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "RSA no comment");
        return -1;
    }

    rc = _libssh2_rsa_new(&rsa,
                          e, (unsigned long)elen,
                          n, (unsigned long)nlen,
                          d, (unsigned long)dlen,
                          p, (unsigned long)plen,
                          q, (unsigned long)qlen,
                          NULL, 0, NULL, 0,
                          coeff, (unsigned long)coefflen);
    if(rc) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Could not create RSA private key"));
        goto fail;
    }

#ifndef USE_OPENSSL_3
    if(rsa)
        rc = _libssh2_rsa_new_additional_parameters(rsa);
#endif

    if(rsa && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = rsa;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_RSA(pk, rsa);
#endif

        rc = gen_publickey_from_rsa_evp(session, method, method_len,
                                        pubkeydata, pubkeydata_len,
                                        pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

    if(rsa_ctx)
        *rsa_ctx = rsa;
    else
        _libssh2_rsa_free(rsa);

    return rc;

fail:

    if(rsa)
        _libssh2_rsa_free(rsa);

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}